

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void SerializeMany<HashWriter,int,uint256,uint256,unsigned_int,unsigned_int,unsigned_int>
               (HashWriter *s,int *args,uint256 *args_1,uint256 *args_2,uint *args_3,uint *args_4,
               uint *args_5)

{
  long in_FS_OFFSET;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = *args;
  CSHA256::Write(&s->ctx,(uchar *)&local_3c,4);
  CSHA256::Write(&s->ctx,(uchar *)args_1,0x20);
  CSHA256::Write(&s->ctx,(uchar *)args_2,0x20);
  local_3c = *args_3;
  CSHA256::Write(&s->ctx,(uchar *)&local_3c,4);
  local_3c = *args_4;
  CSHA256::Write(&s->ctx,(uchar *)&local_3c,4);
  local_3c = *args_5;
  CSHA256::Write(&s->ctx,(uchar *)&local_3c,4);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}